

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16781328,_true,_embree::avx::VirtualCurveIntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  bool bVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  char cVar15;
  AABBNodeMB4D *node1;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong *puVar21;
  ulong uVar22;
  ulong uVar23;
  float fVar24;
  float fVar32;
  float fVar33;
  vint4 bi;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar34;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar35;
  float fVar43;
  float fVar44;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar45;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  vint4 bi_1;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  vint4 ai;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  vint4 ai_1;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  vint4 ai_3;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar71;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar72 [16];
  float fVar76;
  float fVar79;
  float fVar80;
  undefined1 auVar77 [16];
  float fVar81;
  undefined1 auVar78 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar85;
  float fVar86;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar87 [16];
  float fVar92;
  float fVar93;
  NodeRef stack [244];
  size_t local_7d8;
  ulong local_7d0 [244];
  
  puVar21 = local_7d0;
  local_7d8 = root.ptr;
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4);
  auVar69._4_4_ = fVar3;
  auVar69._0_4_ = fVar3;
  auVar69._8_4_ = fVar3;
  auVar69._12_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar70._4_4_ = fVar4;
  auVar70._0_4_ = fVar4;
  auVar70._8_4_ = fVar4;
  auVar70._12_4_ = fVar4;
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar77._4_4_ = fVar5;
  auVar77._0_4_ = fVar5;
  auVar77._8_4_ = fVar5;
  auVar77._12_4_ = fVar5;
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar7 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar8 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar86 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar35 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar24 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar60 = ZEXT416((uint)(fVar86 * 0.99999964));
  auVar60 = vshufps_avx(auVar60,auVar60,0);
  auVar61 = ZEXT416((uint)(fVar35 * 0.99999964));
  auVar61 = vshufps_avx(auVar61,auVar61,0);
  auVar52 = ZEXT416((uint)(fVar24 * 0.99999964));
  auVar52 = vshufps_avx(auVar52,auVar52,0);
  auVar25 = ZEXT416((uint)(fVar86 * 1.0000004));
  auVar25 = vshufps_avx(auVar25,auVar25,0);
  auVar26 = ZEXT416((uint)(fVar35 * 1.0000004));
  auVar26 = vshufps_avx(auVar26,auVar26,0);
  auVar27 = ZEXT416((uint)(fVar24 * 1.0000004));
  auVar27 = vshufps_avx(auVar27,auVar27,0);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar9 = (tray->tnear).field_0.i[k];
  auVar82._4_4_ = iVar9;
  auVar82._0_4_ = iVar9;
  auVar82._8_4_ = iVar9;
  auVar82._12_4_ = iVar9;
  iVar9 = (tray->tfar).field_0.i[k];
  auVar87._4_4_ = iVar9;
  auVar87._0_4_ = iVar9;
  auVar87._8_4_ = iVar9;
  auVar87._12_4_ = iVar9;
LAB_00343732:
  do {
    bVar10 = puVar21 != &local_7d8;
    if (puVar21 == &local_7d8) {
      return bVar10;
    }
    uVar20 = puVar21[-1];
    puVar21 = puVar21 + -1;
    while ((uVar20 & 8) == 0) {
      fVar86 = *(float *)(ray + k * 4 + 0x70);
      uVar17 = (uint)uVar20 & 7;
      uVar16 = uVar20 & 0xfffffffffffffff0;
      if (uVar17 == 3) {
        auVar28 = vshufps_avx(ZEXT416((uint)fVar86),ZEXT416((uint)fVar86),0);
        fVar71 = auVar28._0_4_;
        fVar73 = auVar28._4_4_;
        fVar74 = auVar28._8_4_;
        fVar75 = auVar28._12_4_;
        fVar86 = 1.0 - fVar86;
        auVar28 = vshufps_avx(ZEXT416((uint)(fVar86 * 0.0)),ZEXT416((uint)(fVar86 * 0.0)),0);
        fVar76 = auVar28._0_4_;
        fVar79 = auVar28._4_4_;
        fVar80 = auVar28._8_4_;
        fVar81 = auVar28._12_4_;
        auVar38._0_4_ =
             fVar6 * *(float *)(uVar16 + 0x20) +
             fVar7 * *(float *)(uVar16 + 0x50) + *(float *)(uVar16 + 0x80) * fVar8;
        auVar38._4_4_ =
             fVar6 * *(float *)(uVar16 + 0x24) +
             fVar7 * *(float *)(uVar16 + 0x54) + *(float *)(uVar16 + 0x84) * fVar8;
        auVar38._8_4_ =
             fVar6 * *(float *)(uVar16 + 0x28) +
             fVar7 * *(float *)(uVar16 + 0x58) + *(float *)(uVar16 + 0x88) * fVar8;
        auVar38._12_4_ =
             fVar6 * *(float *)(uVar16 + 0x2c) +
             fVar7 * *(float *)(uVar16 + 0x5c) + *(float *)(uVar16 + 0x8c) * fVar8;
        auVar78._0_4_ =
             *(float *)(uVar16 + 0x30) * fVar6 +
             *(float *)(uVar16 + 0x60) * fVar7 + *(float *)(uVar16 + 0x90) * fVar8;
        auVar78._4_4_ =
             *(float *)(uVar16 + 0x34) * fVar6 +
             *(float *)(uVar16 + 100) * fVar7 + *(float *)(uVar16 + 0x94) * fVar8;
        auVar78._8_4_ =
             *(float *)(uVar16 + 0x38) * fVar6 +
             *(float *)(uVar16 + 0x68) * fVar7 + *(float *)(uVar16 + 0x98) * fVar8;
        auVar78._12_4_ =
             *(float *)(uVar16 + 0x3c) * fVar6 +
             *(float *)(uVar16 + 0x6c) * fVar7 + *(float *)(uVar16 + 0x9c) * fVar8;
        auVar83._0_4_ =
             *(float *)(uVar16 + 0x40) * fVar6 +
             *(float *)(uVar16 + 0x70) * fVar7 + fVar8 * *(float *)(uVar16 + 0xa0);
        auVar83._4_4_ =
             *(float *)(uVar16 + 0x44) * fVar6 +
             *(float *)(uVar16 + 0x74) * fVar7 + fVar8 * *(float *)(uVar16 + 0xa4);
        auVar83._8_4_ =
             *(float *)(uVar16 + 0x48) * fVar6 +
             *(float *)(uVar16 + 0x78) * fVar7 + fVar8 * *(float *)(uVar16 + 0xa8);
        auVar83._12_4_ =
             *(float *)(uVar16 + 0x4c) * fVar6 +
             *(float *)(uVar16 + 0x7c) * fVar7 + fVar8 * *(float *)(uVar16 + 0xac);
        auVar50._8_4_ = 0x7fffffff;
        auVar50._0_8_ = 0x7fffffff7fffffff;
        auVar50._12_4_ = 0x7fffffff;
        auVar28 = vandps_avx(auVar38,auVar50);
        auVar29._8_4_ = 0x219392ef;
        auVar29._0_8_ = 0x219392ef219392ef;
        auVar29._12_4_ = 0x219392ef;
        auVar28 = vcmpps_avx(auVar28,auVar29,1);
        auVar38 = vblendvps_avx(auVar38,auVar29,auVar28);
        auVar28 = vandps_avx(auVar78,auVar50);
        auVar28 = vcmpps_avx(auVar28,auVar29,1);
        auVar12 = vblendvps_avx(auVar78,auVar29,auVar28);
        auVar28 = vandps_avx(auVar83,auVar50);
        auVar28 = vcmpps_avx(auVar28,auVar29,1);
        auVar28 = vblendvps_avx(auVar83,auVar29,auVar28);
        auVar13 = vshufps_avx(ZEXT416((uint)fVar86),ZEXT416((uint)fVar86),0);
        fVar85 = auVar13._0_4_;
        auVar84._0_4_ = fVar85 + fVar71 * *(float *)(uVar16 + 0x110);
        fVar88 = auVar13._4_4_;
        auVar84._4_4_ = fVar88 + fVar73 * *(float *)(uVar16 + 0x114);
        fVar90 = auVar13._8_4_;
        auVar84._8_4_ = fVar90 + fVar74 * *(float *)(uVar16 + 0x118);
        fVar92 = auVar13._12_4_;
        auVar84._12_4_ = fVar92 + fVar75 * *(float *)(uVar16 + 0x11c);
        auVar72._0_4_ = fVar85 + fVar71 * *(float *)(uVar16 + 0x130);
        auVar72._4_4_ = fVar88 + fVar73 * *(float *)(uVar16 + 0x134);
        auVar72._8_4_ = fVar90 + fVar74 * *(float *)(uVar16 + 0x138);
        auVar72._12_4_ = fVar92 + fVar75 * *(float *)(uVar16 + 0x13c);
        auVar13 = vrcpps_avx(auVar38);
        fVar86 = auVar13._0_4_;
        auVar39._0_4_ = auVar38._0_4_ * fVar86;
        fVar89 = auVar13._4_4_;
        auVar39._4_4_ = auVar38._4_4_ * fVar89;
        fVar91 = auVar13._8_4_;
        auVar39._8_4_ = auVar38._8_4_ * fVar91;
        fVar93 = auVar13._12_4_;
        auVar39._12_4_ = auVar38._12_4_ * fVar93;
        auVar51._8_4_ = 0x3f800000;
        auVar51._0_8_ = 0x3f8000003f800000;
        auVar51._12_4_ = 0x3f800000;
        auVar38 = vsubps_avx(auVar51,auVar39);
        fVar86 = fVar86 + fVar86 * auVar38._0_4_;
        fVar89 = fVar89 + fVar89 * auVar38._4_4_;
        fVar91 = fVar91 + fVar91 * auVar38._8_4_;
        fVar93 = fVar93 + fVar93 * auVar38._12_4_;
        auVar38 = vrcpps_avx(auVar12);
        fVar35 = auVar38._0_4_;
        auVar40._0_4_ = auVar12._0_4_ * fVar35;
        fVar43 = auVar38._4_4_;
        auVar40._4_4_ = auVar12._4_4_ * fVar43;
        fVar44 = auVar38._8_4_;
        auVar40._8_4_ = auVar12._8_4_ * fVar44;
        fVar45 = auVar38._12_4_;
        auVar40._12_4_ = auVar12._12_4_ * fVar45;
        auVar38 = vsubps_avx(auVar51,auVar40);
        fVar35 = fVar35 + fVar35 * auVar38._0_4_;
        fVar43 = fVar43 + fVar43 * auVar38._4_4_;
        fVar44 = fVar44 + fVar44 * auVar38._8_4_;
        fVar45 = fVar45 + fVar45 * auVar38._12_4_;
        auVar38 = vrcpps_avx(auVar28);
        fVar24 = auVar38._0_4_;
        auVar57._0_4_ = auVar28._0_4_ * fVar24;
        fVar32 = auVar38._4_4_;
        auVar57._4_4_ = auVar28._4_4_ * fVar32;
        fVar33 = auVar38._8_4_;
        auVar57._8_4_ = auVar28._8_4_ * fVar33;
        fVar34 = auVar38._12_4_;
        auVar57._12_4_ = auVar28._12_4_ * fVar34;
        auVar28 = vsubps_avx(auVar51,auVar57);
        fVar24 = fVar24 + fVar24 * auVar28._0_4_;
        fVar32 = fVar32 + fVar32 * auVar28._4_4_;
        fVar33 = fVar33 + fVar33 * auVar28._8_4_;
        fVar34 = fVar34 + fVar34 * auVar28._12_4_;
        auVar58._0_4_ =
             fVar3 * *(float *)(uVar16 + 0x20) +
             fVar4 * *(float *)(uVar16 + 0x50) +
             fVar5 * *(float *)(uVar16 + 0x80) + *(float *)(uVar16 + 0xb0);
        auVar58._4_4_ =
             fVar3 * *(float *)(uVar16 + 0x24) +
             fVar4 * *(float *)(uVar16 + 0x54) +
             fVar5 * *(float *)(uVar16 + 0x84) + *(float *)(uVar16 + 0xb4);
        auVar58._8_4_ =
             fVar3 * *(float *)(uVar16 + 0x28) +
             fVar4 * *(float *)(uVar16 + 0x58) +
             fVar5 * *(float *)(uVar16 + 0x88) + *(float *)(uVar16 + 0xb8);
        auVar58._12_4_ =
             fVar3 * *(float *)(uVar16 + 0x2c) +
             fVar4 * *(float *)(uVar16 + 0x5c) +
             fVar5 * *(float *)(uVar16 + 0x8c) + *(float *)(uVar16 + 0xbc);
        auVar64._0_4_ =
             fVar3 * *(float *)(uVar16 + 0x30) +
             fVar4 * *(float *)(uVar16 + 0x60) +
             fVar5 * *(float *)(uVar16 + 0x90) + *(float *)(uVar16 + 0xc0);
        auVar64._4_4_ =
             fVar3 * *(float *)(uVar16 + 0x34) +
             fVar4 * *(float *)(uVar16 + 100) +
             fVar5 * *(float *)(uVar16 + 0x94) + *(float *)(uVar16 + 0xc4);
        auVar64._8_4_ =
             fVar3 * *(float *)(uVar16 + 0x38) +
             fVar4 * *(float *)(uVar16 + 0x68) +
             fVar5 * *(float *)(uVar16 + 0x98) + *(float *)(uVar16 + 200);
        auVar64._12_4_ =
             fVar3 * *(float *)(uVar16 + 0x3c) +
             fVar4 * *(float *)(uVar16 + 0x6c) +
             fVar5 * *(float *)(uVar16 + 0x9c) + *(float *)(uVar16 + 0xcc);
        auVar67._0_4_ =
             fVar3 * *(float *)(uVar16 + 0x40) +
             fVar4 * *(float *)(uVar16 + 0x70) +
             fVar5 * *(float *)(uVar16 + 0xa0) + *(float *)(uVar16 + 0xd0);
        auVar67._4_4_ =
             fVar3 * *(float *)(uVar16 + 0x44) +
             fVar4 * *(float *)(uVar16 + 0x74) +
             fVar5 * *(float *)(uVar16 + 0xa4) + *(float *)(uVar16 + 0xd4);
        auVar67._8_4_ =
             fVar3 * *(float *)(uVar16 + 0x48) +
             fVar4 * *(float *)(uVar16 + 0x78) +
             fVar5 * *(float *)(uVar16 + 0xa8) + *(float *)(uVar16 + 0xd8);
        auVar67._12_4_ =
             fVar3 * *(float *)(uVar16 + 0x4c) +
             fVar4 * *(float *)(uVar16 + 0x7c) +
             fVar5 * *(float *)(uVar16 + 0xac) + *(float *)(uVar16 + 0xdc);
        auVar28._4_4_ = fVar79 + fVar73 * *(float *)(uVar16 + 0xe4);
        auVar28._0_4_ = fVar76 + fVar71 * *(float *)(uVar16 + 0xe0);
        auVar28._8_4_ = fVar80 + fVar74 * *(float *)(uVar16 + 0xe8);
        auVar28._12_4_ = fVar81 + fVar75 * *(float *)(uVar16 + 0xec);
        auVar28 = vsubps_avx(auVar28,auVar58);
        auVar38 = vsubps_avx(auVar84,auVar58);
        auVar12._4_4_ = fVar79 + fVar73 * *(float *)(uVar16 + 0xf4);
        auVar12._0_4_ = fVar76 + fVar71 * *(float *)(uVar16 + 0xf0);
        auVar12._8_4_ = fVar80 + fVar74 * *(float *)(uVar16 + 0xf8);
        auVar12._12_4_ = fVar81 + fVar75 * *(float *)(uVar16 + 0xfc);
        auVar12 = vsubps_avx(auVar12,auVar64);
        auVar13._4_4_ = fVar88 + fVar73 * *(float *)(uVar16 + 0x124);
        auVar13._0_4_ = fVar85 + fVar71 * *(float *)(uVar16 + 0x120);
        auVar13._8_4_ = fVar90 + fVar74 * *(float *)(uVar16 + 0x128);
        auVar13._12_4_ = fVar92 + fVar75 * *(float *)(uVar16 + 300);
        auVar13 = vsubps_avx(auVar13,auVar64);
        auVar14._4_4_ = fVar79 + fVar73 * *(float *)(uVar16 + 0x104);
        auVar14._0_4_ = fVar76 + fVar71 * *(float *)(uVar16 + 0x100);
        auVar14._8_4_ = fVar80 + fVar74 * *(float *)(uVar16 + 0x108);
        auVar14._12_4_ = fVar81 + fVar75 * *(float *)(uVar16 + 0x10c);
        auVar14 = vsubps_avx(auVar14,auVar67);
        auVar29 = vsubps_avx(auVar72,auVar67);
        auVar66._0_4_ = fVar86 * auVar28._0_4_;
        auVar66._4_4_ = fVar89 * auVar28._4_4_;
        auVar66._8_4_ = fVar91 * auVar28._8_4_;
        auVar66._12_4_ = fVar93 * auVar28._12_4_;
        auVar59._0_4_ = fVar86 * auVar38._0_4_;
        auVar59._4_4_ = fVar89 * auVar38._4_4_;
        auVar59._8_4_ = fVar91 * auVar38._8_4_;
        auVar59._12_4_ = fVar93 * auVar38._12_4_;
        auVar68._0_4_ = auVar12._0_4_ * fVar35;
        auVar68._4_4_ = auVar12._4_4_ * fVar43;
        auVar68._8_4_ = auVar12._8_4_ * fVar44;
        auVar68._12_4_ = auVar12._12_4_ * fVar45;
        auVar65._0_4_ = auVar14._0_4_ * fVar24;
        auVar65._4_4_ = auVar14._4_4_ * fVar32;
        auVar65._8_4_ = auVar14._8_4_ * fVar33;
        auVar65._12_4_ = auVar14._12_4_ * fVar34;
        auVar41._0_4_ = auVar13._0_4_ * fVar35;
        auVar41._4_4_ = auVar13._4_4_ * fVar43;
        auVar41._8_4_ = auVar13._8_4_ * fVar44;
        auVar41._12_4_ = auVar13._12_4_ * fVar45;
        auVar30._0_4_ = auVar29._0_4_ * fVar24;
        auVar30._4_4_ = auVar29._4_4_ * fVar32;
        auVar30._8_4_ = auVar29._8_4_ * fVar33;
        auVar30._12_4_ = auVar29._12_4_ * fVar34;
        auVar28 = vpminsd_avx(auVar68,auVar41);
        auVar38 = vpminsd_avx(auVar65,auVar30);
        auVar28 = vmaxps_avx(auVar28,auVar38);
        auVar14 = vpminsd_avx(auVar66,auVar59);
        auVar13 = vpmaxsd_avx(auVar66,auVar59);
        auVar38 = vpmaxsd_avx(auVar68,auVar41);
        auVar12 = vpmaxsd_avx(auVar65,auVar30);
        auVar12 = vminps_avx(auVar38,auVar12);
        auVar38 = vmaxps_avx(auVar82,auVar14);
        auVar28 = vmaxps_avx(auVar38,auVar28);
        auVar38 = vminps_avx(auVar87,auVar13);
        auVar38 = vminps_avx(auVar38,auVar12);
        auVar42._0_4_ = auVar28._0_4_ * 0.99999964;
        auVar42._4_4_ = auVar28._4_4_ * 0.99999964;
        auVar42._8_4_ = auVar28._8_4_ * 0.99999964;
        auVar42._12_4_ = auVar28._12_4_ * 0.99999964;
        auVar31._0_4_ = auVar38._0_4_ * 1.0000004;
        auVar31._4_4_ = auVar38._4_4_ * 1.0000004;
        auVar31._8_4_ = auVar38._8_4_ * 1.0000004;
        auVar31._12_4_ = auVar38._12_4_ * 1.0000004;
        auVar28 = vcmpps_avx(auVar42,auVar31,2);
      }
      else {
        auVar13 = vshufps_avx(ZEXT416((uint)fVar86),ZEXT416((uint)fVar86),0);
        pfVar2 = (float *)(uVar16 + 0x80 + uVar22);
        fVar86 = auVar13._0_4_;
        fVar35 = auVar13._4_4_;
        fVar24 = auVar13._8_4_;
        fVar89 = auVar13._12_4_;
        pfVar1 = (float *)(uVar16 + 0x20 + uVar22);
        auVar36._0_4_ = fVar86 * *pfVar2 + *pfVar1;
        auVar36._4_4_ = fVar35 * pfVar2[1] + pfVar1[1];
        auVar36._8_4_ = fVar24 * pfVar2[2] + pfVar1[2];
        auVar36._12_4_ = fVar89 * pfVar2[3] + pfVar1[3];
        auVar28 = vsubps_avx(auVar36,auVar69);
        pfVar2 = (float *)(uVar16 + 0x80 + uVar19);
        auVar37._0_4_ = auVar60._0_4_ * auVar28._0_4_;
        auVar37._4_4_ = auVar60._4_4_ * auVar28._4_4_;
        auVar37._8_4_ = auVar60._8_4_ * auVar28._8_4_;
        auVar37._12_4_ = auVar60._12_4_ * auVar28._12_4_;
        pfVar1 = (float *)(uVar16 + 0x20 + uVar19);
        auVar46._0_4_ = fVar86 * *pfVar2 + *pfVar1;
        auVar46._4_4_ = fVar35 * pfVar2[1] + pfVar1[1];
        auVar46._8_4_ = fVar24 * pfVar2[2] + pfVar1[2];
        auVar46._12_4_ = fVar89 * pfVar2[3] + pfVar1[3];
        auVar28 = vsubps_avx(auVar46,auVar70);
        pfVar2 = (float *)(uVar16 + 0x80 + uVar23);
        pfVar1 = (float *)(uVar16 + 0x20 + uVar23);
        auVar53._0_4_ = fVar86 * *pfVar2 + *pfVar1;
        auVar53._4_4_ = fVar35 * pfVar2[1] + pfVar1[1];
        auVar53._8_4_ = fVar24 * pfVar2[2] + pfVar1[2];
        auVar53._12_4_ = fVar89 * pfVar2[3] + pfVar1[3];
        auVar47._0_4_ = auVar61._0_4_ * auVar28._0_4_;
        auVar47._4_4_ = auVar61._4_4_ * auVar28._4_4_;
        auVar47._8_4_ = auVar61._8_4_ * auVar28._8_4_;
        auVar47._12_4_ = auVar61._12_4_ * auVar28._12_4_;
        auVar28 = vsubps_avx(auVar53,auVar77);
        auVar54._0_4_ = auVar52._0_4_ * auVar28._0_4_;
        auVar54._4_4_ = auVar52._4_4_ * auVar28._4_4_;
        auVar54._8_4_ = auVar52._8_4_ * auVar28._8_4_;
        auVar54._12_4_ = auVar52._12_4_ * auVar28._12_4_;
        auVar28 = vmaxps_avx(auVar47,auVar54);
        auVar38 = vmaxps_avx(auVar82,auVar37);
        auVar28 = vmaxps_avx(auVar38,auVar28);
        pfVar2 = (float *)(uVar16 + 0x80 + (uVar22 ^ 0x10));
        pfVar1 = (float *)(uVar16 + 0x20 + (uVar22 ^ 0x10));
        auVar48._0_4_ = fVar86 * *pfVar2 + *pfVar1;
        auVar48._4_4_ = fVar35 * pfVar2[1] + pfVar1[1];
        auVar48._8_4_ = fVar24 * pfVar2[2] + pfVar1[2];
        auVar48._12_4_ = fVar89 * pfVar2[3] + pfVar1[3];
        auVar38 = vsubps_avx(auVar48,auVar69);
        auVar49._0_4_ = auVar25._0_4_ * auVar38._0_4_;
        auVar49._4_4_ = auVar25._4_4_ * auVar38._4_4_;
        auVar49._8_4_ = auVar25._8_4_ * auVar38._8_4_;
        auVar49._12_4_ = auVar25._12_4_ * auVar38._12_4_;
        pfVar2 = (float *)(uVar16 + 0x80 + (uVar19 ^ 0x10));
        pfVar1 = (float *)(uVar16 + 0x20 + (uVar19 ^ 0x10));
        auVar55._0_4_ = fVar86 * *pfVar2 + *pfVar1;
        auVar55._4_4_ = fVar35 * pfVar2[1] + pfVar1[1];
        auVar55._8_4_ = fVar24 * pfVar2[2] + pfVar1[2];
        auVar55._12_4_ = fVar89 * pfVar2[3] + pfVar1[3];
        auVar38 = vsubps_avx(auVar55,auVar70);
        auVar56._0_4_ = auVar26._0_4_ * auVar38._0_4_;
        auVar56._4_4_ = auVar26._4_4_ * auVar38._4_4_;
        auVar56._8_4_ = auVar26._8_4_ * auVar38._8_4_;
        auVar56._12_4_ = auVar26._12_4_ * auVar38._12_4_;
        pfVar2 = (float *)(uVar16 + 0x80 + (uVar23 ^ 0x10));
        pfVar1 = (float *)(uVar16 + 0x20 + (uVar23 ^ 0x10));
        auVar62._0_4_ = fVar86 * *pfVar2 + *pfVar1;
        auVar62._4_4_ = fVar35 * pfVar2[1] + pfVar1[1];
        auVar62._8_4_ = fVar24 * pfVar2[2] + pfVar1[2];
        auVar62._12_4_ = fVar89 * pfVar2[3] + pfVar1[3];
        auVar38 = vsubps_avx(auVar62,auVar77);
        auVar63._0_4_ = auVar27._0_4_ * auVar38._0_4_;
        auVar63._4_4_ = auVar27._4_4_ * auVar38._4_4_;
        auVar63._8_4_ = auVar27._8_4_ * auVar38._8_4_;
        auVar63._12_4_ = auVar27._12_4_ * auVar38._12_4_;
        auVar38 = vminps_avx(auVar56,auVar63);
        auVar12 = vminps_avx(auVar87,auVar49);
        auVar38 = vminps_avx(auVar12,auVar38);
        if (uVar17 == 6) {
          auVar38 = vcmpps_avx(auVar28,auVar38,2);
          auVar28 = vcmpps_avx(*(undefined1 (*) [16])(uVar16 + 0xe0),auVar13,2);
          auVar12 = vcmpps_avx(auVar13,*(undefined1 (*) [16])(uVar16 + 0xf0),1);
          auVar28 = vandps_avx(auVar28,auVar12);
          auVar28 = vandps_avx(auVar28,auVar38);
        }
        else {
          auVar28 = vcmpps_avx(auVar28,auVar38,2);
        }
      }
      auVar28 = vpslld_avx(auVar28,0x1f);
      uVar17 = vmovmskps_avx(auVar28);
      if (uVar17 == 0) goto LAB_00343732;
      uVar17 = uVar17 & 0xff;
      lVar11 = 0;
      if (uVar17 != 0) {
        for (; (uVar17 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
        }
      }
      uVar20 = *(ulong *)(uVar16 + lVar11 * 8);
      uVar17 = uVar17 - 1 & uVar17;
      if (uVar17 != 0) {
        *puVar21 = uVar20;
        puVar21 = puVar21 + 1;
        lVar11 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
          }
        }
        uVar20 = *(ulong *)(uVar16 + lVar11 * 8);
        uVar17 = uVar17 - 1 & uVar17;
        uVar18 = (ulong)uVar17;
        if (uVar17 != 0) {
          do {
            *puVar21 = uVar20;
            puVar21 = puVar21 + 1;
            lVar11 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
              }
            }
            uVar20 = *(ulong *)(uVar16 + lVar11 * 8);
            uVar18 = uVar18 & uVar18 - 1;
          } while (uVar18 != 0);
        }
      }
    }
    cVar15 = (**(code **)((long)This->leafIntersector +
                         (ulong)*(byte *)(uVar20 & 0xfffffffffffffff0) * 0x40 + 0x18))
                       (pre,ray,k,context);
    if (cVar15 != '\0') {
      *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
      return bVar10;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }